

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::FieldIdentifierTest(void)

{
  bool bVar1;
  IDLOptions local_93f8;
  Parser local_90e8;
  IDLOptions local_8968;
  Parser local_8658;
  IDLOptions local_7ed8;
  Parser local_7bc8;
  IDLOptions local_7448;
  Parser local_7138;
  IDLOptions local_69b8;
  Parser local_66a8;
  IDLOptions local_5f28;
  Parser local_5c18;
  IDLOptions local_5498;
  Parser local_5188;
  IDLOptions local_4a08;
  Parser local_46f8;
  IDLOptions local_3f78;
  Parser local_3c68;
  IDLOptions local_34e8;
  Parser local_31d8;
  IDLOptions local_2a58;
  Parser local_2748;
  IDLOptions local_1fc8;
  Parser local_1cb8;
  IDLOptions local_1538;
  Parser local_1228;
  IDLOptions local_a98;
  Parser local_788;
  
  IDLOptions::IDLOptions(&local_a98);
  Parser::Parser(&local_788,&local_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:0); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ f: int (id:0); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x38c,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&local_a98);
  IDLOptions::IDLOptions(&local_1538);
  Parser::Parser(&local_1228,&local_1538);
  bVar1 = Parser::Parse(&local_1228,"table T{ f: int (id:text); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,"\'false\' != \'Parser().Parse(\"table T{ f: int (id:text); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x38e,"");
  Parser::~Parser(&local_1228);
  IDLOptions::~IDLOptions(&local_1538);
  IDLOptions::IDLOptions(&local_1fc8);
  Parser::Parser(&local_1cb8,&local_1fc8);
  bVar1 = Parser::Parse(&local_1cb8,"table T{ f: int (id:\"text\"); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"table T{ f: int (id:\\\"text\\\"); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x38f,"");
  Parser::~Parser(&local_1cb8);
  IDLOptions::~IDLOptions(&local_1fc8);
  IDLOptions::IDLOptions(&local_2a58);
  Parser::Parser(&local_2748,&local_2a58);
  bVar1 = Parser::Parse(&local_2748,"table T{ f: int (id:0text); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,"\'false\' != \'Parser().Parse(\"table T{ f: int (id:0text); }\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x390,"");
  Parser::~Parser(&local_2748);
  IDLOptions::~IDLOptions(&local_2a58);
  IDLOptions::IDLOptions(&local_34e8);
  Parser::Parser(&local_31d8,&local_34e8);
  bVar1 = Parser::Parse(&local_31d8,"table T{ f: int (id:1.0); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,"\'false\' != \'Parser().Parse(\"table T{ f: int (id:1.0); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x391,"");
  Parser::~Parser(&local_31d8);
  IDLOptions::~IDLOptions(&local_34e8);
  IDLOptions::IDLOptions(&local_3f78);
  Parser::Parser(&local_3c68,&local_3f78);
  bVar1 = Parser::Parse(&local_3c68,"table T{ f: int (id:-1); g: int (id:0); }",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"table T{ f: int (id:-1); g: int (id:0); }\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x392,"");
  Parser::~Parser(&local_3c68);
  IDLOptions::~IDLOptions(&local_3f78);
  IDLOptions::IDLOptions(&local_4a08);
  Parser::Parser(&local_46f8,&local_4a08);
  bVar1 = Parser::Parse(&local_46f8,"table T{ f: int (id:129496726); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"table T{ f: int (id:129496726); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x393,"");
  Parser::~Parser(&local_46f8);
  IDLOptions::~IDLOptions(&local_4a08);
  IDLOptions::IDLOptions(&local_5498);
  Parser::Parser(&local_5188,&local_5498);
  bVar1 = Parser::Parse(&local_5188,"union X{} table T{ u: X(id:0); table F{x:int;\n}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"union X{} table T{ u: X(id:0); table F{x:int;\\n}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x396,"");
  Parser::~Parser(&local_5188);
  IDLOptions::~IDLOptions(&local_5498);
  IDLOptions::IDLOptions(&local_5f28);
  Parser::Parser(&local_5c18,&local_5f28);
  bVar1 = Parser::Parse(&local_5c18,"union X{} table T{ u: X (id:1); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'Parser().Parse(\"union X{} table T{ u: X (id:1); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x398,"");
  Parser::~Parser(&local_5c18);
  IDLOptions::~IDLOptions(&local_5f28);
  IDLOptions::IDLOptions(&local_69b8);
  Parser::Parser(&local_66a8,&local_69b8);
  bVar1 = Parser::Parse(&local_66a8,"union X{} table T{ u: X; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"union X{} table T{ u: X; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x399,"");
  Parser::~Parser(&local_66a8);
  IDLOptions::~IDLOptions(&local_69b8);
  IDLOptions::IDLOptions(&local_7448);
  Parser::Parser(&local_7138,&local_7448);
  bVar1 = Parser::Parse(&local_7138,"table T{ nan: string; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ nan: string; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39b,"");
  Parser::~Parser(&local_7138);
  IDLOptions::~IDLOptions(&local_7448);
  IDLOptions::IDLOptions(&local_7ed8);
  Parser::Parser(&local_7bc8,&local_7ed8);
  bVar1 = Parser::Parse(&local_7bc8,"table T{ inf: string; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ inf: string; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39c,"");
  Parser::~Parser(&local_7bc8);
  IDLOptions::~IDLOptions(&local_7ed8);
  IDLOptions::IDLOptions(&local_8968);
  Parser::Parser(&local_8658,&local_8968);
  bVar1 = Parser::Parse(&local_8658,"table T{ inf: float = inf; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ inf: float = inf; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39e,"");
  Parser::~Parser(&local_8658);
  IDLOptions::~IDLOptions(&local_8968);
  IDLOptions::IDLOptions(&local_93f8);
  Parser::Parser(&local_90e8,&local_93f8);
  bVar1 = Parser::Parse(&local_90e8,"table T{ nan: float = inf; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ nan: float = inf; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39f,"");
  Parser::~Parser(&local_90e8);
  IDLOptions::~IDLOptions(&local_93f8);
  return;
}

Assistant:

void FieldIdentifierTest() {
  using flatbuffers::Parser;
  TEST_EQ(true, Parser().Parse("table T{ f: int (id:0); }"));
  // non-integer `id` should be rejected
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:text); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:\"text\"); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:0text); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:1.0); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:-1); g: int (id:0); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:129496726); }"));
  // A unuion filed occupys two ids: enumerator + pointer (offset).
  TEST_EQ(false,
          Parser().Parse("union X{} table T{ u: X(id:0); table F{x:int;\n}"));
  // Positive tests for unions
  TEST_EQ(true, Parser().Parse("union X{} table T{ u: X (id:1); }"));
  TEST_EQ(true, Parser().Parse("union X{} table T{ u: X; }"));
  // Test using 'inf' and 'nan' words both as identifiers and as default values.
  TEST_EQ(true, Parser().Parse("table T{ nan: string; }"));
  TEST_EQ(true, Parser().Parse("table T{ inf: string; }"));
#if defined(FLATBUFFERS_HAS_NEW_STRTOD) && (FLATBUFFERS_HAS_NEW_STRTOD > 0)
  TEST_EQ(true, Parser().Parse("table T{ inf: float = inf; }"));
  TEST_EQ(true, Parser().Parse("table T{ nan: float = inf; }"));
#endif
}